

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O3

void __thiscall
btConeTwistConstraint::computeConeLimitInfo
          (btConeTwistConstraint *this,btQuaternion *qCone,btScalar *swingAngle,
          btVector3 *vSwingAxis,btScalar *swingLimit)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar5 [16];
  
  fVar2 = (qCone->super_btQuadWord).m_floats[3];
  fVar8 = -1.0;
  if (-1.0 <= fVar2) {
    fVar8 = fVar2;
  }
  fVar2 = 1.0;
  if (fVar8 <= 1.0) {
    fVar2 = fVar8;
  }
  fVar2 = acosf(fVar2);
  *swingAngle = fVar2 + fVar2;
  if (1.1920929e-07 < fVar2 + fVar2) {
    fVar2 = (qCone->super_btQuadWord).m_floats[0];
    uVar1 = *(undefined8 *)((qCone->super_btQuadWord).m_floats + 1);
    vSwingAxis->m_floats[3] = 0.0;
    fVar8 = (float)uVar1;
    fVar3 = (float)((ulong)uVar1 >> 0x20);
    fVar7 = 1.0 / SQRT(fVar3 * fVar3 + fVar2 * fVar2 + fVar8 * fVar8);
    vSwingAxis->m_floats[0] = fVar2 * fVar7;
    fVar8 = fVar7 * fVar8;
    fVar7 = fVar7 * fVar3;
    *(ulong *)(vSwingAxis->m_floats + 1) = CONCAT44(fVar7,fVar8);
    fVar2 = this->m_swingSpan1;
    *swingLimit = fVar2;
    if (1.1920929e-07 < ABS(fVar8)) {
      fVar3 = (fVar7 * fVar7) / (fVar8 * fVar8);
      fVar8 = (this->m_swingAxis).m_floats[0];
      auVar5._0_8_ = (undefined8)DAT_001f16c0;
      auVar5._8_4_ = DAT_001f16c0._4_4_;
      auVar5._12_4_ = fVar7 * fVar7;
      auVar4._8_8_ = auVar5._8_8_;
      auVar4._0_4_ = (undefined4)DAT_001f16c0;
      auVar4._4_4_ = fVar3;
      auVar6._4_4_ = fVar2 * fVar2;
      auVar6._0_4_ = this->m_swingSpan2 * this->m_swingSpan2;
      auVar6._8_4_ = this->m_fixThresh * this->m_fixThresh;
      auVar6._12_4_ = fVar8 * fVar8;
      auVar6 = divps(auVar4,auVar6);
      *swingLimit = SQRT((fVar3 + 1.0) / (auVar6._4_4_ + auVar6._0_4_));
    }
  }
  return;
}

Assistant:

void btConeTwistConstraint::computeConeLimitInfo(const btQuaternion& qCone,
												 btScalar& swingAngle, // out
												 btVector3& vSwingAxis, // out
												 btScalar& swingLimit) // out
{
	swingAngle = qCone.getAngle();
	if (swingAngle > SIMD_EPSILON)
	{
		vSwingAxis = btVector3(qCone.x(), qCone.y(), qCone.z());
		vSwingAxis.normalize();
#if 0
        // non-zero twist?! this should never happen.
       btAssert(fabs(vSwingAxis.x()) <= SIMD_EPSILON));
#endif
        
		// Compute limit for given swing. tricky:
		// Given a swing axis, we're looking for the intersection with the bounding cone ellipse.
		// (Since we're dealing with angles, this ellipse is embedded on the surface of a sphere.)

		// For starters, compute the direction from center to surface of ellipse.
		// This is just the perpendicular (ie. rotate 2D vector by PI/2) of the swing axis.
		// (vSwingAxis is the cone rotation (in z,y); change vars and rotate to (x,y) coords.)
		btScalar xEllipse =  vSwingAxis.y();
		btScalar yEllipse = -vSwingAxis.z();

		// Now, we use the slope of the vector (using x/yEllipse) and find the length
		// of the line that intersects the ellipse:
		//  x^2   y^2
		//  --- + --- = 1, where a and b are semi-major axes 2 and 1 respectively (ie. the limits)
		//  a^2   b^2
		// Do the math and it should be clear.

		swingLimit = m_swingSpan1; // if xEllipse == 0, we have a pure vSwingAxis.z rotation: just use swingspan1
		if (fabs(xEllipse) > SIMD_EPSILON)
		{
			btScalar surfaceSlope2 = (yEllipse*yEllipse)/(xEllipse*xEllipse);
			btScalar norm = 1 / (m_swingSpan2 * m_swingSpan2);
			norm += surfaceSlope2 / (m_swingSpan1 * m_swingSpan1);
			btScalar swingLimit2 = (1 + surfaceSlope2) / norm;
			swingLimit = sqrt(swingLimit2);
		}

		// test!
		/*swingLimit = m_swingSpan2;
		if (fabs(vSwingAxis.z()) > SIMD_EPSILON)
		{
		btScalar mag_2 = m_swingSpan1*m_swingSpan1 + m_swingSpan2*m_swingSpan2;
		btScalar sinphi = m_swingSpan2 / sqrt(mag_2);
		btScalar phi = asin(sinphi);
		btScalar theta = atan2(fabs(vSwingAxis.y()),fabs(vSwingAxis.z()));
		btScalar alpha = 3.14159f - theta - phi;
		btScalar sinalpha = sin(alpha);
		swingLimit = m_swingSpan1 * sinphi/sinalpha;
		}*/
	}
	else if (swingAngle < 0)
	{
		// this should never happen!
#if 0
        btAssert(0);
#endif
 	}
}